

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O2

void __thiscall
Move::Move(Move *this,string *word,int r,int c,int bsize,bool across,int score,int blank_pos,int h)

{
  (this->word)._M_dataplus._M_p = (pointer)&(this->word).field_2;
  (this->word)._M_string_length = 0;
  (this->word).field_2._M_local_buf[0] = '\0';
  this->heur_score = 0;
  (this->swap_letters)._M_dataplus._M_p = (pointer)&(this->swap_letters).field_2;
  (this->swap_letters)._M_string_length = 0;
  (this->swap_letters).field_2._M_local_buf[0] = '\0';
  this->bsize = bsize;
  set_all(this,word,r,c,across,score,blank_pos,h);
  return;
}

Assistant:

Move(const std::string &word, int r, int c, int bsize, bool across = true, int score = 0, int blank_pos = -1,
         int h = 0) {
        this->bsize = bsize;
        this->set_all(word, r, c, across, score, blank_pos, h);
    }